

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

int duckdb::DecimalScaleUpCheckOperator::Operation<long,int>
              (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  undefined1 auVar2 [16];
  int result;
  string error;
  int local_b4;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  if (input < *(long *)((long)dataptr + 0x20) && -*(long *)((long)dataptr + 0x20) < input) {
    bVar1 = TryCast::Operation<long,int>(input,&local_b4,false);
    if (!bVar1) {
      auVar2 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,int>(&local_b0,(duckdb *)input,auVar2._8_8_);
      InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_b0);
      __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_b4 = local_b4 * *(int *)((long)dataptr + 0x28);
  }
  else {
    local_90[0] = local_80;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Casting value \"%s\" to type %s failed: value is out of range!",
               "");
    Decimal::ToString_abi_cxx11_
              (&local_50,(Decimal *)input,(ulong)*(byte *)((long)dataptr + 0x2c),
               *(uint8_t *)((long)dataptr + 0x2d),in_R8B);
    LogicalType::ToString_abi_cxx11_(&local_70,(LogicalType *)(*dataptr + 8));
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_b0,(StringUtil *)local_90,&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000081,in_R8B));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    local_b4 = HandleVectorCastError::Operation<int>
                         (&local_b0,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  return local_b4;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}